

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* dot<double>(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *__return_storage_ptr__,
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *matrix1,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *matrix2)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pdVar4;
  long lVar5;
  pointer pdVar6;
  long lVar7;
  pointer pvVar8;
  long lVar9;
  long lVar10;
  int j;
  long lVar11;
  int k;
  long lVar12;
  allocator_type local_52;
  allocator_type local_51;
  value_type_conflict2 local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  pvVar1 = (matrix1->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (matrix1->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (matrix2->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (long)*(pointer *)
                    ((long)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + 8) -
             *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data >> 3,&local_50,&local_51);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,((long)pvVar1 - (long)pvVar2) / 0x18,(value_type *)&local_48,
           &local_52);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  pvVar1 = (matrix1->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (matrix1->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (lVar10 = 0; lVar10 != ((long)pvVar2 - (long)pvVar1) / 0x18; lVar10 = lVar10 + 1) {
    pdVar4 = *(pointer *)
              ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data + 8);
    lVar5 = *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data;
    for (lVar11 = 0; lVar11 != (long)pdVar4 - lVar5 >> 3; lVar11 = lVar11 + 1) {
      pvVar3 = (matrix2->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = *(pointer *)
                ((long)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + 8);
      lVar7 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      pvVar8 = (__return_storage_ptr__->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (lVar12 = 0; (long)pdVar6 - lVar7 >> 3 != lVar12; lVar12 = lVar12 + 1) {
        lVar9 = *(long *)&pvVar8[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        *(double *)(lVar9 + lVar12 * 8) =
             *(double *)
              (*(long *)&pvVar1[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
              + lVar11 * 8) *
             *(double *)
              (*(long *)&pvVar3[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl
              + lVar12 * 8) + *(double *)(lVar9 + lVar12 * 8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T> > dot(std::vector<std::vector<T> > matrix1, std::vector<std::vector<T> > matrix2){
    std::vector<std::vector<T> > resultMatrix(matrix1.size(), std::vector<T>(matrix2[0].size(), 0));
    for(int i=0; i<matrix1.size(); i++){
        for(int j=0; j<matrix1[0].size(); j++){
            for(int k=0; k<matrix2[0].size(); k++){
                resultMatrix[i][k] += matrix1[i][j] * matrix2[j][k];
            }
        }
    }
    return resultMatrix;
}